

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformCollection::moveContents
          (UniformCollection *this,UniformCollection *receiver)

{
  long *plVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  long lVar4;
  pointer pUVar5;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer pUVar8;
  pointer pUVar9;
  
  pUVar9 = (this->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar5 = (this->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pUVar5 - (long)pUVar9) >> 3) * -0x49249249) {
    lVar6 = 0;
    lVar4 = 0;
    do {
      addUniform(receiver,(Uniform *)((long)&(pUVar9->name)._M_dataplus._M_p + lVar6));
      lVar4 = lVar4 + 1;
      pUVar9 = (this->m_uniforms).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar5 = (this->m_uniforms).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + 0x38;
    } while (lVar4 < (int)((ulong)((long)pUVar5 - (long)pUVar9) >> 3) * -0x49249249);
  }
  if (pUVar5 != pUVar9) {
    paVar7 = &(pUVar9->name).field_2;
    do {
      glu::VarType::~VarType((VarType *)(paVar7 + 1));
      plVar1 = (long *)(((string *)(paVar7 + -1))->_M_dataplus)._M_p;
      if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar1) {
        operator_delete(plVar1,paVar7->_M_allocated_capacity + 1);
      }
      pUVar8 = (pointer)((long)paVar7 + 0x28);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar7 + 0x38);
    } while (pUVar8 != pUVar5);
    (this->m_uniforms).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar9;
  }
  ppSVar2 = (this->m_structTypes).
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar3 = (this->m_structTypes).
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppSVar3 - (long)ppSVar2) >> 3)) {
    lVar4 = 0;
    do {
      addStructType(receiver,ppSVar2[lVar4]);
      lVar4 = lVar4 + 1;
      ppSVar2 = (this->m_structTypes).
                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar3 = (this->m_structTypes).
                super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar4 < (int)((ulong)((long)ppSVar3 - (long)ppSVar2) >> 3));
  }
  if (ppSVar3 != ppSVar2) {
    (this->m_structTypes).
    super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar2;
  }
  return;
}

Assistant:

void moveContents (UniformCollection& receiver)
	{
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			receiver.addUniform(m_uniforms[i]);
		m_uniforms.clear();

		for (int i = 0; i < (int)m_structTypes.size(); i++)
			receiver.addStructType(m_structTypes[i]);
		m_structTypes.clear();
	}